

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Bar.cxx
# Opt level: O0

int __thiscall Fl_Menu_Bar::handle(Fl_Menu_Bar *this,int event)

{
  int Y;
  int W;
  int H;
  int iVar1;
  Fl_Menu_Item *pFVar2;
  Fl_Menu_Item *local_28;
  Fl_Menu_Item *v;
  int event_local;
  Fl_Menu_Bar *this_local;
  
  pFVar2 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  if ((pFVar2 != (Fl_Menu_Item *)0x0) &&
     (pFVar2 = Fl_Menu_::menu(&this->super_Fl_Menu_), pFVar2->text != (char *)0x0)) {
    if (event == 1) {
      local_28 = (Fl_Menu_Item *)0x0;
LAB_00201cc8:
      pFVar2 = Fl_Menu_::menu(&this->super_Fl_Menu_);
      iVar1 = Fl_Widget::x((Fl_Widget *)this);
      Y = Fl_Widget::y((Fl_Widget *)this);
      W = Fl_Widget::w((Fl_Widget *)this);
      H = Fl_Widget::h((Fl_Widget *)this);
      pFVar2 = Fl_Menu_Item::pulldown
                         (pFVar2,iVar1,Y,W,H,local_28,&this->super_Fl_Menu_,(Fl_Menu_Item *)0x0,1);
      Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar2);
      return 1;
    }
    if (event - 3U < 2) {
      return 1;
    }
    if (event == 0xc) {
      iVar1 = Fl_Widget::visible_r((Fl_Widget *)this);
      if (iVar1 != 0) {
        pFVar2 = Fl_Menu_::menu(&this->super_Fl_Menu_);
        local_28 = Fl_Menu_Item::find_shortcut(pFVar2,(int *)0x0,true);
        if ((local_28 != (Fl_Menu_Item *)0x0) &&
           (iVar1 = Fl_Menu_Item::submenu(local_28), iVar1 != 0)) goto LAB_00201cc8;
      }
      pFVar2 = Fl_Menu_::test_shortcut(&this->super_Fl_Menu_);
      return (uint)(pFVar2 != (Fl_Menu_Item *)0x0);
    }
  }
  return 0;
}

Assistant:

int Fl_Menu_Bar::handle(int event) {
  const Fl_Menu_Item* v;
  if (menu() && menu()->text) switch (event) {
  case FL_ENTER:
  case FL_LEAVE:
    return 1;
  case FL_PUSH:
    v = 0;
  J1:
    v = menu()->pulldown(x(), y(), w(), h(), v, this, 0, 1);
    picked(v);
    return 1;
  case FL_SHORTCUT:
    if (visible_r()) {
      v = menu()->find_shortcut(0, true);
      if (v && v->submenu()) goto J1;
    }
    return test_shortcut() != 0;
  }
  return 0;
}